

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_type.c
# Opt level: O1

C_Type * C_func_type(C_Parser *parser,C_Type *return_ty)

{
  C_Type *pCVar1;
  
  pCVar1 = (C_Type *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x78);
  pCVar1->kind = TY_FUNC;
  pCVar1->size = 1;
  pCVar1->align = 1;
  pCVar1->return_ty = return_ty;
  return pCVar1;
}

Assistant:

C_Type *C_func_type(C_Parser *parser, C_Type *return_ty) {
  // The C spec disallows sizeof(<function type>), but
  // GCC allows that and the expression is evaluated to 1.
  C_Type *ty = new_type(parser, TY_FUNC, 1, 1);
  ty->return_ty = return_ty;
  return ty;
}